

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_moving_multiscale
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL *displaced,REF_DBL *scalar,
          REF_RECON_RECONSTRUCTION reconstruction,REF_INT p_norm,REF_DBL gradation,
          REF_DBL complexity)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  double local_b0;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_INT j;
  REF_INT i;
  REF_DBL det;
  REF_DBL *xyz;
  REF_DBL *hess;
  REF_DBL *grad;
  REF_DBL *x;
  REF_DBL *jac;
  REF_NODE ref_node;
  REF_DBL complexity_local;
  REF_DBL gradation_local;
  REF_INT p_norm_local;
  REF_RECON_RECONSTRUCTION reconstruction_local;
  REF_DBL *scalar_local;
  REF_DBL *displaced_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  jac = (REF_DBL *)ref_grid->node;
  ref_node = (REF_NODE)complexity;
  complexity_local = gradation;
  gradation_local._0_4_ = p_norm;
  gradation_local._4_4_ = reconstruction;
  _p_norm_local = scalar;
  scalar_local = displaced;
  displaced_local = (REF_DBL *)ref_grid;
  ref_grid_local = (REF_GRID)metric;
  if (ref_grid->node->max * 6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x9c8,
           "ref_metric_moving_multiscale","malloc hess of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    xyz = (REF_DBL *)malloc((long)(ref_grid->node->max * 6) << 3);
    if (xyz == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x9c8,"ref_metric_moving_multiscale","malloc hess of REF_DBL NULL");
      metric_local._4_4_ = 2;
    }
    else if (*(int *)((long)displaced_local[1] + 4) * 9 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x9c9,"ref_metric_moving_multiscale","malloc jac of REF_DBL negative");
      metric_local._4_4_ = 1;
    }
    else {
      x = (REF_DBL *)malloc((long)(*(int *)((long)displaced_local[1] + 4) * 9) << 3);
      if (x == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x9c9,"ref_metric_moving_multiscale","malloc jac of REF_DBL NULL");
        metric_local._4_4_ = 2;
      }
      else if (*(int *)((long)displaced_local[1] + 4) < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x9ca,"ref_metric_moving_multiscale","malloc x of REF_DBL negative");
        metric_local._4_4_ = 1;
      }
      else {
        grad = (REF_DBL *)malloc((long)*(int *)((long)displaced_local[1] + 4) << 3);
        if (grad == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x9ca,"ref_metric_moving_multiscale","malloc x of REF_DBL NULL");
          metric_local._4_4_ = 2;
        }
        else if (*(int *)((long)displaced_local[1] + 4) * 3 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x9cb,"ref_metric_moving_multiscale","malloc grad of REF_DBL negative");
          metric_local._4_4_ = 1;
        }
        else {
          hess = (REF_DBL *)malloc((long)(*(int *)((long)displaced_local[1] + 4) * 3) << 3);
          if (hess == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x9cb,"ref_metric_moving_multiscale","malloc grad of REF_DBL NULL");
            metric_local._4_4_ = 2;
          }
          else {
            for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
                ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
              for (ref_private_macro_code_rss_1 = 0;
                  ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4);
                  ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                if (((-1 < ref_private_macro_code_rss_1) &&
                    (ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4))) &&
                   (-1 < *(long *)(*(long *)((long)displaced_local[1] + 0x10) +
                                  (long)ref_private_macro_code_rss_1 * 8))) {
                  grad[ref_private_macro_code_rss_1] =
                       scalar_local[ref_private_macro_code_rss + ref_private_macro_code_rss_1 * 3];
                }
              }
              uVar1 = ref_recon_gradient((REF_GRID)displaced_local,grad,hess,gradation_local._4_4_);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x9d1,"ref_metric_moving_multiscale",(ulong)uVar1,"recon x");
                return uVar1;
              }
              if (*(int *)(displaced_local + 0x21) != 0) {
                for (ref_private_macro_code_rss_1 = 0;
                    ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4);
                    ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                  if (((-1 < ref_private_macro_code_rss_1) &&
                      (ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4))) &&
                     (-1 < *(long *)(*(long *)((long)displaced_local[1] + 0x10) +
                                    (long)ref_private_macro_code_rss_1 * 8))) {
                    hess[ref_private_macro_code_rss_1 * 3 + 2] = 1.0;
                  }
                }
              }
              for (ref_private_macro_code_rss_1 = 0;
                  ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4);
                  ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                if (((-1 < ref_private_macro_code_rss_1) &&
                    (ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4))) &&
                   (-1 < *(long *)(*(long *)((long)displaced_local[1] + 0x10) +
                                  (long)ref_private_macro_code_rss_1 * 8))) {
                  for (node = 0; node < 3; node = node + 1) {
                    x[node + ref_private_macro_code_rss * 3 + ref_private_macro_code_rss_1 * 9] =
                         hess[node + ref_private_macro_code_rss_1 * 3];
                  }
                }
              }
            }
            if (hess != (REF_DBL *)0x0) {
              free(hess);
            }
            if (grad != (REF_DBL *)0x0) {
              free(grad);
            }
            if (*(int *)((long)displaced_local[1] + 4) * 3 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x9e0,"ref_metric_moving_multiscale","malloc xyz of REF_DBL negative");
              metric_local._4_4_ = 1;
            }
            else {
              det = (REF_DBL)malloc((long)(*(int *)((long)displaced_local[1] + 4) * 3) << 3);
              if ((void *)det == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x9e0,"ref_metric_moving_multiscale","malloc xyz of REF_DBL NULL");
                metric_local._4_4_ = 2;
              }
              else {
                for (ref_private_macro_code_rss_1 = 0;
                    ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4);
                    ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                  if (((-1 < ref_private_macro_code_rss_1) &&
                      (ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4))) &&
                     (-1 < *(long *)(*(long *)((long)displaced_local[1] + 0x10) +
                                    (long)ref_private_macro_code_rss_1 * 8))) {
                    for (node = 0; node < 3; node = node + 1) {
                      *(undefined8 *)
                       ((long)det + (long)(node + ref_private_macro_code_rss_1 * 3) * 8) =
                           *(undefined8 *)
                            ((long)jac[7] + (long)(node + ref_private_macro_code_rss_1 * 0xf) * 8);
                      *(REF_DBL *)
                       ((long)jac[7] + (long)(node + ref_private_macro_code_rss_1 * 0xf) * 8) =
                           scalar_local[node + ref_private_macro_code_rss_1 * 3];
                    }
                  }
                }
                uVar1 = ref_recon_hessian((REF_GRID)displaced_local,_p_norm_local,xyz,
                                          gradation_local._4_4_);
                if (uVar1 == 0) {
                  for (ref_private_macro_code_rss_1 = 0;
                      ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4);
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    if (((-1 < ref_private_macro_code_rss_1) &&
                        (ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4))) &&
                       (-1 < *(long *)(*(long *)((long)displaced_local[1] + 0x10) +
                                      (long)ref_private_macro_code_rss_1 * 8))) {
                      for (node = 0; node < 3; node = node + 1) {
                        *(undefined8 *)
                         ((long)jac[7] + (long)(node + ref_private_macro_code_rss_1 * 0xf) * 8) =
                             *(undefined8 *)
                              ((long)det + (long)(node + ref_private_macro_code_rss_1 * 3) * 8);
                      }
                    }
                  }
                  if (det != 0.0) {
                    free((void *)det);
                  }
                  uVar1 = ref_recon_roundoff_limit(xyz,(REF_GRID)displaced_local);
                  if (uVar1 == 0) {
                    for (ref_private_macro_code_rss_1 = 0;
                        ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4);
                        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                      if (((-1 < ref_private_macro_code_rss_1) &&
                          (ref_private_macro_code_rss_1 < *(int *)((long)displaced_local[1] + 4)))
                         && (-1 < *(long *)(*(long *)((long)displaced_local[1] + 0x10) +
                                           (long)ref_private_macro_code_rss_1 * 8))) {
                        uVar1 = ref_matrix_jac_m_jact
                                          (x + ref_private_macro_code_rss_1 * 9,
                                           xyz + ref_private_macro_code_rss_1 * 6,
                                           (REF_DBL *)
                                           (ref_grid_local->cell +
                                           (long)(ref_private_macro_code_rss_1 * 6) + -2));
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                 ,0x9f4,"ref_metric_moving_multiscale",(ulong)uVar1,"J M J^t");
                          return uVar1;
                        }
                        uVar1 = ref_matrix_det_gen(3,x + ref_private_macro_code_rss_1 * 9,
                                                   (REF_DBL *)&j);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                 ,0x9f6,"ref_metric_moving_multiscale",(ulong)uVar1,"gen det");
                          return uVar1;
                        }
                        for (node = 0; node < 6; node = node + 1) {
                          if (_j <= 0.0) {
                            local_b0 = -_j;
                          }
                          else {
                            local_b0 = _j;
                          }
                          dVar3 = pow(local_b0,1.0 / (double)gradation_local._0_4_);
                          lVar2 = (long)(node + ref_private_macro_code_rss_1 * 6);
                          ref_grid_local->cell[lVar2 + -2] =
                               (REF_CELL)(dVar3 * (double)ref_grid_local->cell[lVar2 + -2]);
                        }
                      }
                    }
                    if (x != (REF_DBL *)0x0) {
                      free(x);
                    }
                    if (xyz != (REF_DBL *)0x0) {
                      free(xyz);
                    }
                    uVar1 = ref_metric_local_scale
                                      ((REF_DBL *)ref_grid_local,(REF_GRID)displaced_local,
                                       gradation_local._0_4_);
                    if (uVar1 == 0) {
                      metric_local._4_4_ =
                           ref_metric_gradation_at_complexity
                                     ((REF_DBL *)ref_grid_local,(REF_GRID)displaced_local,
                                      complexity_local,(REF_DBL)ref_node);
                      if (metric_local._4_4_ == 0) {
                        metric_local._4_4_ = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0xa01,"ref_metric_moving_multiscale",(ulong)metric_local._4_4_,
                               "gradation at complexity");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x9fe,"ref_metric_moving_multiscale",(ulong)uVar1,
                             "local scale lp norm");
                      metric_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x9f0,"ref_metric_moving_multiscale",(ulong)uVar1,
                           "floor metric eigenvalues based on grid size and solution jitter");
                    metric_local._4_4_ = uVar1;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x9e7,"ref_metric_moving_multiscale",(ulong)uVar1,"recon");
                  metric_local._4_4_ = uVar1;
                }
              }
            }
          }
        }
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_moving_multiscale(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL *displaced, REF_DBL *scalar,
    REF_RECON_RECONSTRUCTION reconstruction, REF_INT p_norm, REF_DBL gradation,
    REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *jac, *x, *grad, *hess, *xyz, det;
  REF_INT i, j, node;
  ref_malloc(hess, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(jac, 9 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(x, ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(grad, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  for (j = 0; j < 3; j++) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      x[node] = displaced[j + 3 * node];
    }
    RSS(ref_recon_gradient(ref_grid, x, grad, reconstruction), "recon x");
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        grad[2 + 3 * node] = 1.0;
      }
    }
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      for (i = 0; i < 3; i++) {
        jac[i + 3 * j + 9 * node] = grad[i + 3 * node];
      }
    }
  }
  ref_free(grad);
  ref_free(x);

  ref_malloc(xyz, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 3; i++) {
      xyz[i + 3 * node] = ref_node_xyz(ref_node, i, node);
      ref_node_xyz(ref_node, i, node) = displaced[i + 3 * node];
    }
  }
  RSS(ref_recon_hessian(ref_grid, scalar, hess, reconstruction), "recon");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 3; i++) {
      ref_node_xyz(ref_node, i, node) = xyz[i + 3 * node];
    }
  }
  ref_free(xyz);

  RSS(ref_recon_roundoff_limit(hess, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_jac_m_jact(&(jac[9 * node]), &(hess[6 * node]),
                              &(metric[6 * node])),
        "J M J^t");

    RSS(ref_matrix_det_gen(3, &(jac[9 * node]), &det), "gen det");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *= pow(ABS(det), 1.0 / (REF_DBL)p_norm);
    }
  }
  ref_free(jac);
  ref_free(hess);

  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}